

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O2

void __thiscall btMLCPSolver::createMLCPFast(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  btMatrixXf *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  uint rows;
  uint uVar4;
  int iVar5;
  btSolverConstraint **ppbVar6;
  float *pfVar7;
  float *pfVar8;
  btSolverConstraint *pbVar9;
  btSolverBody *pbVar10;
  btRigidBody *pbVar11;
  btRigidBody *pbVar12;
  undefined1 auVar13 [16];
  long lVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  btVector3 bVar29;
  CProfileSample __profile_7;
  CProfileSample __profile_2;
  undefined1 auStack_e4 [12];
  float *local_d0;
  float *local_b0;
  CProfileSample __profile_6;
  btScalar bStack_9c;
  btScalar bStack_98;
  btScalar bStack_94;
  btAlignedObjectArray<btJointNode> jointNodeArray;
  btAlignedObjectArray<int> bodyJointNodeArray;
  
  uVar22 = (uint)interleaveContactAndFriction;
  rows = (this->m_allConstraintPtrArray).m_size;
  CProfileManager::Start_Profile("init b (rhs)");
  btVectorX<float>::resize(&this->m_b,rows);
  btVectorX<float>::resize(&this->m_bSplit,rows);
  btVectorX<float>::setZero(&this->m_b);
  btVectorX<float>::setZero(&this->m_bSplit);
  uVar22 = uVar22 * 2 + 1;
  ppbVar6 = (this->m_allConstraintPtrArray).m_data;
  pfVar7 = (this->m_b).m_storage.m_data;
  pfVar8 = (this->m_bSplit).m_storage.m_data;
  uVar19 = 0;
  uVar25 = 0;
  if (0 < (int)rows) {
    uVar25 = (ulong)rows;
  }
  for (; uVar25 != uVar19; uVar19 = uVar19 + 1) {
    pbVar9 = ppbVar6[uVar19];
    fVar1 = pbVar9->m_jacDiagABInv;
    if (1.1920929e-07 <= ABS(fVar1)) {
      fVar2 = pbVar9->m_rhsPenetration;
      pfVar7[uVar19] = pbVar9->m_rhs / fVar1;
      pfVar8[uVar19] = fVar2 / fVar1;
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)&bodyJointNodeArray);
  btVectorX<float>::resize(&this->m_lo,rows);
  btVectorX<float>::resize(&this->m_hi,rows);
  CProfileManager::Start_Profile("init lo/ho");
  ppbVar6 = (this->m_allConstraintPtrArray).m_data;
  pfVar7 = (this->m_lo).m_storage.m_data;
  pfVar8 = (this->m_hi).m_storage.m_data;
  for (uVar19 = 0; uVar25 != uVar19; uVar19 = uVar19 + 1) {
    pbVar9 = ppbVar6[uVar19];
    pfVar7[uVar19] = pbVar9->m_lowerLimit;
    pfVar8[uVar19] = pbVar9->m_upperLimit;
  }
  CProfileSample::~CProfileSample((CProfileSample *)&bodyJointNodeArray);
  iVar16 = (this->m_allConstraintPtrArray).m_size;
  iVar23 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_size;
  bodyJointNodeArray.m_ownsMemory = true;
  bodyJointNodeArray.m_data = (int *)0x0;
  bodyJointNodeArray.m_size = 0;
  bodyJointNodeArray.m_capacity = 0;
  CProfileManager::Start_Profile("bodyJointNodeArray.resize");
  jointNodeArray._0_4_ = 0xffffffff;
  btAlignedObjectArray<int>::resize(&bodyJointNodeArray,iVar23,(int *)&jointNodeArray);
  CProfileSample::~CProfileSample(&__profile_2);
  jointNodeArray.m_ownsMemory = true;
  jointNodeArray.m_data = (btJointNode *)0x0;
  jointNodeArray.m_size = 0;
  jointNodeArray.m_capacity = 0;
  CProfileManager::Start_Profile("jointNodeArray.reserve");
  btAlignedObjectArray<btJointNode>::reserve
            (&jointNodeArray,(this->m_allConstraintPtrArray).m_size * 2);
  CProfileSample::~CProfileSample(&__profile_2);
  if ((createMLCPFast(btContactSolverInfo_const&)::J3 == '\0') &&
     (iVar23 = __cxa_guard_acquire(&createMLCPFast(btContactSolverInfo_const&)::J3), iVar23 != 0)) {
    btMatrixX<float>::btMatrixX(&createMLCPFast::J3);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCPFast::J3,&__dso_handle);
    __cxa_guard_release(&createMLCPFast(btContactSolverInfo_const&)::J3);
  }
  CProfileManager::Start_Profile("J3.resize");
  iVar16 = iVar16 * 2;
  btMatrixX<float>::resize(&createMLCPFast::J3,iVar16,8);
  CProfileSample::~CProfileSample(&__profile_2);
  if ((createMLCPFast(btContactSolverInfo_const&)::JinvM3 == '\0') &&
     (iVar23 = __cxa_guard_acquire(&createMLCPFast(btContactSolverInfo_const&)::JinvM3), iVar23 != 0
     )) {
    btMatrixX<float>::btMatrixX(&createMLCPFast::JinvM3);
    __cxa_atexit(btMatrixX<float>::~btMatrixX,&createMLCPFast::JinvM3,&__dso_handle);
    __cxa_guard_release(&createMLCPFast(btContactSolverInfo_const&)::JinvM3);
  }
  CProfileManager::Start_Profile("JinvM3.resize/setZero");
  btMatrixX<float>::resize(&createMLCPFast::JinvM3,iVar16,8);
  btMatrixX<float>::setZero(&createMLCPFast::JinvM3);
  btMatrixX<float>::setZero(&createMLCPFast::J3);
  CProfileSample::~CProfileSample(&__profile_2);
  if ((createMLCPFast(btContactSolverInfo_const&)::ofs == '\0') &&
     (iVar16 = __cxa_guard_acquire(&createMLCPFast(btContactSolverInfo_const&)::ofs), iVar16 != 0))
  {
    createMLCPFast::ofs.m_ownsMemory = true;
    createMLCPFast::ofs.m_data = (int *)0x0;
    createMLCPFast::ofs.m_size = 0;
    createMLCPFast::ofs.m_capacity = 0;
    __cxa_atexit(btAlignedObjectArray<int>::~btAlignedObjectArray,&createMLCPFast::ofs,&__dso_handle
                );
    __cxa_guard_release(&createMLCPFast(btContactSolverInfo_const&)::ofs);
  }
  CProfileManager::Start_Profile("ofs resize");
  auVar13._12_4_ = 0;
  auVar13._0_12_ = auStack_e4;
  ___profile_2 = (btJointNode)(auVar13 << 0x20);
  btAlignedObjectArray<int>::resize(&createMLCPFast::ofs,0,(int *)&__profile_2);
  btAlignedObjectArray<int>::resizeNoInitialize
            (&createMLCPFast::ofs,(this->m_allConstraintPtrArray).m_size);
  CProfileSample::~CProfileSample(&__profile_6);
  CProfileManager::Start_Profile("Compute J and JinvM");
  lVar26 = 0;
  iVar16 = 0;
  iVar23 = 0;
  for (iVar27 = 0; iVar27 < (this->m_allConstraintPtrArray).m_size; iVar27 = iVar27 + uVar24) {
    createMLCPFast::ofs.m_data[lVar26] = iVar16;
    uVar24 = uVar22;
    if (iVar27 < (this->super_btSequentialImpulseConstraintSolver).
                 m_tmpSolverNonContactConstraintPool.m_size) {
      uVar24 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.m_data
               [lVar26].m_numConstraintRows;
    }
    lVar18 = (long)iVar27;
    pbVar9 = (this->m_allConstraintPtrArray).m_data[lVar18];
    uVar20 = pbVar9->m_solverBodyIdA;
    uVar4 = pbVar9->m_solverBodyIdB;
    pbVar10 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
    pbVar11 = pbVar10[(int)uVar20].m_originalBody;
    pbVar12 = pbVar10[(int)uVar4].m_originalBody;
    if (pbVar11 == (btRigidBody *)0x0) {
      iVar23 = iVar23 + uVar24;
    }
    else {
      iVar17 = jointNodeArray.m_size;
      ___profile_2 = (btJointNode)ZEXT816(0);
      btAlignedObjectArray<btJointNode>::expand(&jointNodeArray,(btJointNode *)&__profile_2);
      lVar14 = (long)iVar17;
      iVar5 = bodyJointNodeArray.m_data[(int)uVar20];
      bodyJointNodeArray.m_data[(int)uVar20] = iVar17;
      jointNodeArray.m_data[lVar14].nextJointNodeIndex = iVar5;
      jointNodeArray.m_data[lVar14].jointIndex = (int)lVar26;
      jointNodeArray.m_data[lVar14].constraintRowIndex = iVar27;
      jointNodeArray.m_data[lVar14].otherBodyIndex = -(uint)(pbVar12 == (btRigidBody *)0x0) | uVar4;
      uVar19 = 0;
      if (0 < (int)uVar24) {
        uVar19 = (ulong)uVar24;
      }
      for (uVar25 = 0; uVar25 != uVar19; uVar25 = uVar25 + 1) {
        lVar14 = lVar18 + uVar25;
        ___profile_6 = pbVar11->m_inverseMass;
        ___profile_2 = (btJointNode)
                       operator*(&(this->m_allConstraintPtrArray).m_data[lVar14]->m_contactNormal1,
                                 (btScalar *)&__profile_6);
        bVar29 = operator*(&(this->m_allConstraintPtrArray).m_data[lVar14]->m_relpos1CrossNormal,
                           (btMatrix3x3 *)&(pbVar11->super_btCollisionObject).field_0x14c);
        pfVar8 = createMLCPFast::JinvM3.m_storage.m_data;
        pfVar7 = createMLCPFast::J3.m_storage.m_data;
        ___profile_6 = bVar29.m_floats[0];
        bStack_9c = bVar29.m_floats[1];
        bStack_98 = bVar29.m_floats[2];
        bStack_94 = bVar29.m_floats[3];
        pbVar9 = (this->m_allConstraintPtrArray).m_data[lVar14];
        lVar21 = (long)(createMLCPFast::J3.m_cols * iVar23);
        lVar14 = (long)(createMLCPFast::JinvM3.m_cols * iVar23);
        for (lVar28 = 0; lVar28 != 0xc; lVar28 = lVar28 + 4) {
          *(undefined4 *)((long)pfVar7 + lVar28 + lVar21 * 4) =
               *(undefined4 *)((long)(pbVar9->m_contactNormal1).m_floats + lVar28);
          *(undefined4 *)((long)pfVar7 + lVar28 + lVar21 * 4 + 0x10) =
               *(undefined4 *)((long)(pbVar9->m_relpos1CrossNormal).m_floats + lVar28);
          *(undefined4 *)((long)pfVar8 + lVar28 + lVar14 * 4) =
               *(undefined4 *)(&__profile_2 + lVar28);
          *(undefined4 *)((long)pfVar8 + lVar28 + lVar14 * 4 + 0x10) =
               *(undefined4 *)(&__profile_6 + lVar28);
        }
        pfVar7[lVar21 + 3] = 0.0;
        pfVar8[lVar14 + 3] = 0.0;
        createMLCPFast::J3.m_setElemOperations = createMLCPFast::J3.m_setElemOperations + 8;
        pfVar7[lVar21 + 7] = 0.0;
        createMLCPFast::JinvM3.m_setElemOperations = createMLCPFast::JinvM3.m_setElemOperations + 8;
        pfVar8[lVar14 + 7] = 0.0;
        iVar23 = iVar23 + 1;
      }
    }
    if (pbVar12 == (btRigidBody *)0x0) {
      iVar23 = iVar23 + uVar24;
    }
    else {
      iVar17 = jointNodeArray.m_size;
      ___profile_2 = (btJointNode)ZEXT816(0);
      btAlignedObjectArray<btJointNode>::expand(&jointNodeArray,(btJointNode *)&__profile_2);
      lVar14 = (long)iVar17;
      iVar5 = bodyJointNodeArray.m_data[(int)uVar4];
      bodyJointNodeArray.m_data[(int)uVar4] = iVar17;
      jointNodeArray.m_data[lVar14].nextJointNodeIndex = iVar5;
      jointNodeArray.m_data[lVar14].jointIndex = (int)lVar26;
      jointNodeArray.m_data[lVar14].otherBodyIndex = -(uint)(pbVar11 == (btRigidBody *)0x0) | uVar20
      ;
      jointNodeArray.m_data[lVar14].constraintRowIndex = iVar27;
      uVar19 = 0;
      if (0 < (int)uVar24) {
        uVar19 = (ulong)uVar24;
      }
      for (uVar25 = 0; uVar25 != uVar19; uVar25 = uVar25 + 1) {
        lVar14 = uVar25 + lVar18;
        ___profile_6 = pbVar12->m_inverseMass;
        ___profile_2 = (btJointNode)
                       operator*(&(this->m_allConstraintPtrArray).m_data[lVar14]->m_contactNormal2,
                                 (btScalar *)&__profile_6);
        bVar29 = operator*(&(this->m_allConstraintPtrArray).m_data[lVar14]->m_relpos2CrossNormal,
                           (btMatrix3x3 *)&(pbVar12->super_btCollisionObject).field_0x14c);
        pfVar8 = createMLCPFast::JinvM3.m_storage.m_data;
        pfVar7 = createMLCPFast::J3.m_storage.m_data;
        ___profile_6 = bVar29.m_floats[0];
        bStack_9c = bVar29.m_floats[1];
        bStack_98 = bVar29.m_floats[2];
        bStack_94 = bVar29.m_floats[3];
        pbVar9 = (this->m_allConstraintPtrArray).m_data[lVar14];
        lVar21 = (long)(createMLCPFast::J3.m_cols * iVar23);
        lVar14 = (long)(createMLCPFast::JinvM3.m_cols * iVar23);
        for (lVar28 = 0; lVar28 != 0xc; lVar28 = lVar28 + 4) {
          *(undefined4 *)((long)pfVar7 + lVar28 + lVar21 * 4) =
               *(undefined4 *)((long)(pbVar9->m_contactNormal2).m_floats + lVar28);
          *(undefined4 *)((long)pfVar7 + lVar28 + lVar21 * 4 + 0x10) =
               *(undefined4 *)((long)(pbVar9->m_relpos2CrossNormal).m_floats + lVar28);
          *(undefined4 *)((long)pfVar8 + lVar28 + lVar14 * 4) =
               *(undefined4 *)(&__profile_2 + lVar28);
          *(undefined4 *)((long)pfVar8 + lVar28 + lVar14 * 4 + 0x10) =
               *(undefined4 *)(&__profile_6 + lVar28);
        }
        pfVar7[lVar21 + 3] = 0.0;
        pfVar8[lVar14 + 3] = 0.0;
        createMLCPFast::J3.m_setElemOperations = createMLCPFast::J3.m_setElemOperations + 8;
        pfVar7[lVar21 + 7] = 0.0;
        createMLCPFast::JinvM3.m_setElemOperations = createMLCPFast::JinvM3.m_setElemOperations + 8;
        pfVar8[lVar14 + 7] = 0.0;
        iVar23 = iVar23 + 1;
      }
    }
    iVar16 = iVar16 + uVar24;
    lVar26 = lVar26 + 1;
  }
  CProfileSample::~CProfileSample(&__profile_7);
  local_d0 = (float *)0x0;
  local_b0 = (float *)0x0;
  if (createMLCPFast::JinvM3.m_storage.m_size != 0) {
    local_b0 = createMLCPFast::JinvM3.m_storage.m_data;
  }
  if (createMLCPFast::J3.m_storage.m_size != 0) {
    local_d0 = createMLCPFast::J3.m_storage.m_data;
  }
  CProfileManager::Start_Profile("m_A.resize");
  this_00 = &this->m_A;
  btMatrixX<float>::resize(this_00,rows,rows);
  CProfileSample::~CProfileSample(&__profile_2);
  CProfileManager::Start_Profile("m_A.setZero");
  btMatrixX<float>::setZero(this_00);
  CProfileSample::~CProfileSample(&__profile_2);
  CProfileManager::Start_Profile("Compute A");
  lVar26 = 0;
  for (iVar16 = 0; iVar16 < (this->m_allConstraintPtrArray).m_size; iVar16 = iVar16 + uVar24) {
    uVar24 = uVar22;
    if (iVar16 < (this->super_btSequentialImpulseConstraintSolver).
                 m_tmpSolverNonContactConstraintPool.m_size) {
      uVar24 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.m_data
               [lVar26].m_numConstraintRows;
    }
    iVar23 = createMLCPFast::ofs.m_data[lVar26];
    pbVar9 = (this->m_allConstraintPtrArray).m_data[iVar16];
    iVar27 = pbVar9->m_solverBodyIdA;
    iVar5 = pbVar9->m_solverBodyIdB;
    piVar15 = bodyJointNodeArray.m_data + iVar27;
    while (lVar18 = (long)*piVar15, -1 < lVar18) {
      lVar14 = (long)jointNodeArray.m_data[lVar18].jointIndex;
      if (lVar14 < lVar26) {
        uVar20 = uVar22;
        if (jointNodeArray.m_data[lVar18].constraintRowIndex <
            (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
            m_size) {
          uVar20 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.m_data
                   [lVar14].m_numConstraintRows;
        }
        if ((this->m_allConstraintPtrArray).m_data[jointNodeArray.m_data[lVar18].constraintRowIndex]
            ->m_solverBodyIdB == iVar27) {
          iVar17 = uVar20 * 8;
        }
        else {
          iVar17 = 0;
        }
        btMatrixX<float>::multiplyAdd2_p8r
                  (this_00,local_b0 + (long)iVar23 * 0x10,
                   local_d0 + (long)createMLCPFast::ofs.m_data[lVar14] * 0x10 + (long)iVar17,uVar24,
                   uVar20,iVar23,createMLCPFast::ofs.m_data[lVar14]);
      }
      piVar15 = &jointNodeArray.m_data[lVar18].nextJointNodeIndex;
    }
    piVar15 = bodyJointNodeArray.m_data + iVar5;
    while (lVar18 = (long)*piVar15, -1 < lVar18) {
      lVar14 = (long)jointNodeArray.m_data[lVar18].jointIndex;
      if (lVar14 < lVar26) {
        uVar20 = uVar22;
        if (jointNodeArray.m_data[lVar18].constraintRowIndex <
            (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
            m_size) {
          uVar20 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.m_data
                   [lVar14].m_numConstraintRows;
        }
        if ((this->m_allConstraintPtrArray).m_data[jointNodeArray.m_data[lVar18].constraintRowIndex]
            ->m_solverBodyIdB == iVar5) {
          iVar27 = uVar20 * 8;
        }
        else {
          iVar27 = 0;
        }
        btMatrixX<float>::multiplyAdd2_p8r
                  (this_00,local_b0 + (long)iVar23 * 0x10 + (long)(int)uVar24 * 8,
                   local_d0 + (long)createMLCPFast::ofs.m_data[lVar14] * 0x10 + (long)iVar27,uVar24,
                   uVar20,iVar23,createMLCPFast::ofs.m_data[lVar14]);
      }
      piVar15 = &jointNodeArray.m_data[lVar18].nextJointNodeIndex;
    }
    lVar26 = lVar26 + 1;
  }
  CProfileManager::Start_Profile("compute diagonal");
  iVar16 = (this->m_allConstraintPtrArray).m_size;
  lVar26 = 0;
  for (iVar23 = 0; iVar23 < iVar16; iVar23 = iVar23 + uVar24) {
    uVar24 = uVar22;
    if (iVar23 < (this->super_btSequentialImpulseConstraintSolver).
                 m_tmpSolverNonContactConstraintPool.m_size) {
      uVar24 = *(uint *)((long)&((this->super_btSequentialImpulseConstraintSolver).
                                 m_tmpConstraintSizesPool.m_data)->m_numConstraintRows + lVar26);
    }
    lVar18 = (long)iVar23;
    pbVar11 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data
              [(this->m_allConstraintPtrArray).m_data[lVar18]->m_solverBodyIdB].m_originalBody;
    btMatrixX<float>::multiply2_p8r
              (this_00,local_b0 + lVar18 * 0x10,local_d0 + lVar18 * 0x10,uVar24,uVar24,iVar23,iVar23
              );
    if (pbVar11 != (btRigidBody *)0x0) {
      btMatrixX<float>::multiplyAdd2_p8r
                (this_00,local_b0 + lVar18 * 0x10 + (ulong)uVar24 * 8,
                 local_d0 + lVar18 * 0x10 + (ulong)uVar24 * 8,uVar24,uVar24,iVar23,iVar23);
    }
    lVar26 = lVar26 + 8;
  }
  CProfileSample::~CProfileSample(&__profile_6);
  CProfileSample::~CProfileSample(&__profile_2);
  uVar22 = (this->m_A).m_rows;
  iVar16 = (this->m_A).m_cols;
  pfVar7 = (this->m_A).m_storage.m_data;
  iVar23 = (this->m_A).m_setElemOperations;
  uVar25 = 0;
  uVar19 = (ulong)uVar22;
  if ((int)uVar22 < 1) {
    uVar19 = uVar25;
  }
  while( true ) {
    iVar23 = iVar23 + 1;
    if (uVar19 == 0) break;
    iVar27 = (int)uVar25;
    fVar1 = this->m_cfm;
    fVar2 = (infoGlobal->super_btContactSolverInfoData).m_timeStep;
    fVar3 = pfVar7[iVar27];
    (this->m_A).m_setElemOperations = iVar23;
    pfVar7[iVar27] = fVar1 / fVar2 + fVar3;
    uVar25 = (ulong)(uint)(iVar27 + iVar16 + 1);
    uVar19 = uVar19 - 1;
  }
  CProfileManager::Start_Profile("fill the upper triangle ");
  btMatrixX<float>::copyLowerToUpperTriangle(this_00);
  CProfileSample::~CProfileSample(&__profile_2);
  CProfileManager::Start_Profile("resize/init x");
  btVectorX<float>::resize(&this->m_x,rows);
  btVectorX<float>::resize(&this->m_xSplit,rows);
  if (((infoGlobal->super_btContactSolverInfoData).m_solverMode & 4) == 0) {
    btVectorX<float>::setZero(&this->m_x);
    btVectorX<float>::setZero(&this->m_xSplit);
  }
  else {
    uVar22 = (this->m_allConstraintPtrArray).m_size;
    ppbVar6 = (this->m_allConstraintPtrArray).m_data;
    pfVar7 = (this->m_x).m_storage.m_data;
    pfVar8 = (this->m_xSplit).m_storage.m_data;
    uVar25 = 0;
    uVar19 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar19 = uVar25;
    }
    for (; uVar19 != uVar25; uVar25 = uVar25 + 1) {
      pbVar9 = ppbVar6[uVar25];
      pfVar7[uVar25] = pbVar9->m_appliedImpulse;
      pfVar8[uVar25] = pbVar9->m_appliedPushImpulse;
    }
  }
  CProfileSample::~CProfileSample(&__profile_2);
  btAlignedObjectArray<btJointNode>::~btAlignedObjectArray(&jointNodeArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&bodyJointNodeArray);
  return;
}

Assistant:

void btMLCPSolver::createMLCPFast(const btContactSolverInfo& infoGlobal)
{
	int numContactRows = interleaveContactAndFriction ? 3 : 1;

	int numConstraintRows = m_allConstraintPtrArray.size();
	int n = numConstraintRows;
	{
		BT_PROFILE("init b (rhs)");
		m_b.resize(numConstraintRows);
		m_bSplit.resize(numConstraintRows);
		m_b.setZero();
		m_bSplit.setZero();
		for (int i=0;i<numConstraintRows ;i++)
		{
			btScalar jacDiag = m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (!btFuzzyZero(jacDiag))
			{
				btScalar rhs = m_allConstraintPtrArray[i]->m_rhs;
				btScalar rhsPenetration = m_allConstraintPtrArray[i]->m_rhsPenetration;
				m_b[i]=rhs/jacDiag;
				m_bSplit[i] = rhsPenetration/jacDiag;
			}

		}
	}

//	btScalar* w = 0;
//	int nub = 0;

	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	{
		BT_PROFILE("init lo/ho");

		for (int i=0;i<numConstraintRows;i++)
		{
			if (0)//m_limitDependencies[i]>=0)
			{
				m_lo[i] = -BT_INFINITY;
				m_hi[i] = BT_INFINITY;
			} else
			{
				m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
				m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
			}
		}
	}

	//
	int m=m_allConstraintPtrArray.size();

	int numBodies = m_tmpSolverBodyPool.size();
	btAlignedObjectArray<int> bodyJointNodeArray;
	{
		BT_PROFILE("bodyJointNodeArray.resize");
		bodyJointNodeArray.resize(numBodies,-1);
	}
	btAlignedObjectArray<btJointNode> jointNodeArray;
	{
		BT_PROFILE("jointNodeArray.reserve");
		jointNodeArray.reserve(2*m_allConstraintPtrArray.size());
	}

	static btMatrixXu J3;
	{
		BT_PROFILE("J3.resize");
		J3.resize(2*m,8);
	}
	static btMatrixXu JinvM3;
	{
		BT_PROFILE("JinvM3.resize/setZero");

		JinvM3.resize(2*m,8);
		JinvM3.setZero();
		J3.setZero();
	}
	int cur=0;
	int rowOffset = 0;
	static btAlignedObjectArray<int> ofs;
	{
		BT_PROFILE("ofs resize");
		ofs.resize(0);
		ofs.resizeNoInitialize(m_allConstraintPtrArray.size());
	}				
	{
		BT_PROFILE("Compute J and JinvM");
		int c=0;

		int numRows = 0;

		for (int i=0;i<m_allConstraintPtrArray.size();i+=numRows,c++)
		{
			ofs[c] = rowOffset;
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
			btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
			if (orgBodyA)
			{
				{
					int slotA=-1;
					//find free jointNode slot for sbA
					slotA =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbA];
					bodyJointNodeArray[sbA] = slotA;
					jointNodeArray[slotA].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotA].jointIndex = c;
					jointNodeArray[slotA].constraintRowIndex = i;
					jointNodeArray[slotA].otherBodyIndex = orgBodyB ? sbB : -1;
				}
				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMass =				m_allConstraintPtrArray[i+row]->m_contactNormal1 *		orgBodyA->getInvMass();
					btVector3 relPosCrossNormalInvInertia = m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal *	orgBodyA->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal1[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMass[r]);
						JinvM3.setElem(cur,r+4,relPosCrossNormalInvInertia[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			} else
			{
				cur += numRows;
			}
			if (orgBodyB)
			{

				{
					int slotB=-1;
					//find free jointNode slot for sbA
					slotB =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbB];
					bodyJointNodeArray[sbB] = slotB;
					jointNodeArray[slotB].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotB].jointIndex = c;
					jointNodeArray[slotB].otherBodyIndex = orgBodyA ? sbA : -1;
					jointNodeArray[slotB].constraintRowIndex = i;
				}

				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMassB = m_allConstraintPtrArray[i+row]->m_contactNormal2*orgBodyB->getInvMass();
					btVector3 relPosInvInertiaB = m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal * orgBodyB->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal2[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMassB[r]);
						JinvM3.setElem(cur,r+4,relPosInvInertiaB[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			}
			else
			{
				cur += numRows;
			}
			rowOffset+=numRows;

		}
		
	}


	//compute JinvM = J*invM.
	const btScalar* JinvM = JinvM3.getBufferPointer();

	const btScalar* Jptr = J3.getBufferPointer();
	{
		BT_PROFILE("m_A.resize");
		m_A.resize(n,n);
	}
	
	{
		BT_PROFILE("m_A.setZero");
		m_A.setZero();
	}
	int c=0;
	{
		int numRows = 0;
		BT_PROFILE("Compute A");
		for (int i=0;i<m_allConstraintPtrArray.size();i+= numRows,c++)
		{
			int row__ = ofs[c];
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
		//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
					
			const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;

			{
				int startJointNodeA = bodyJointNodeArray[sbA];
				while (startJointNodeA>=0)
				{
					int j0 = jointNodeArray[startJointNodeA].jointIndex;
					int cr0 = jointNodeArray[startJointNodeA].constraintRowIndex;
					if (j0<c)
					{
								 
						int numRowsOther = cr0 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j0].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cr0]->m_solverBodyIdB == sbA) ? 8*numRowsOther  : 0;
						//printf("%d joint i %d and j0: %d: ",count++,i,j0);
						m_A.multiplyAdd2_p8r ( JinvMrow, 
						Jptr + 2*8*(size_t)ofs[j0] + ofsother, numRows, numRowsOther,  row__,ofs[j0]);
					}
					startJointNodeA = jointNodeArray[startJointNodeA].nextJointNodeIndex;
				}
			}

			{
				int startJointNodeB = bodyJointNodeArray[sbB];
				while (startJointNodeB>=0)
				{
					int j1 = jointNodeArray[startJointNodeB].jointIndex;
					int cj1 = jointNodeArray[startJointNodeB].constraintRowIndex;

					if (j1<c)
					{
						int numRowsOther =  cj1 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j1].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cj1]->m_solverBodyIdB == sbB) ? 8*numRowsOther  : 0;
						m_A.multiplyAdd2_p8r ( JinvMrow + 8*(size_t)numRows, 
						Jptr + 2*8*(size_t)ofs[j1] + ofsother, numRows, numRowsOther, row__,ofs[j1]);
					}
					startJointNodeB = jointNodeArray[startJointNodeB].nextJointNodeIndex;
				}
			}
		}

		{
			BT_PROFILE("compute diagonal");
			// compute diagonal blocks of m_A

			int  row__ = 0;
			int numJointRows = m_allConstraintPtrArray.size();

			int jj=0;
			for (;row__<numJointRows;)
			{

				//int sbA = m_allConstraintPtrArray[row__]->m_solverBodyIdA;
				int sbB = m_allConstraintPtrArray[row__]->m_solverBodyIdB;
			//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
				btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;


				const unsigned int infom =  row__ < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[jj].m_numConstraintRows : numContactRows;
				
				const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;
				const btScalar *Jrow = Jptr + 2*8*(size_t)row__;
				m_A.multiply2_p8r (JinvMrow, Jrow, infom, infom, row__,row__);
				if (orgBodyB) 
				{
					m_A.multiplyAdd2_p8r (JinvMrow + 8*(size_t)infom, Jrow + 8*(size_t)infom, infom, infom,  row__,row__);
				}
				row__ += infom;
				jj++;
			}
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}
				   
	///fill the upper triangle of the matrix, to make it symmetric
	{
		BT_PROFILE("fill the upper triangle ");
		m_A.copyLowerToUpperTriangle();
	}

	{
		BT_PROFILE("resize/init x");
		m_x.resize(numConstraintRows);
		m_xSplit.resize(numConstraintRows);

		if (infoGlobal.m_solverMode&SOLVER_USE_WARMSTARTING)
		{
			for (int i=0;i<m_allConstraintPtrArray.size();i++)
			{
				const btSolverConstraint& c = *m_allConstraintPtrArray[i];
				m_x[i]=c.m_appliedImpulse;
				m_xSplit[i] = c.m_appliedPushImpulse;
			}
		} else
		{
			m_x.setZero();
			m_xSplit.setZero();
		}
	}

}